

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O1

Abc_Cex_t * Saig_BmcGenerateCounterExample(Saig_Bmc_t *p)

{
  uint uVar1;
  Vec_Int_t *p_00;
  bool bVar2;
  int iVar3;
  Abc_Cex_t *p_01;
  Aig_Man_t *pAVar4;
  Aig_Obj_t *pAVar5;
  int iVar6;
  int Fill;
  long lVar7;
  
  p_01 = Abc_CexAlloc(p->pAig->nRegs,p->pAig->nTruePis,p->iFrameFail + 1);
  iVar3 = p->iFrameFail;
  p_01->iFrame = iVar3;
  p_01->iPo = p->iOutputFail;
  if (-1 < iVar3) {
    iVar3 = 0;
    do {
      pAVar4 = p->pAig;
      if (0 < pAVar4->nTruePis) {
        lVar7 = 0;
        do {
          if (pAVar4->vCis->nSize <= lVar7) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pAVar5 = Saig_BmcObjFrame(p,(Aig_Obj_t *)pAVar4->vCis->pArray[lVar7],iVar3);
          if (pAVar5 != (Aig_Obj_t *)0x0) {
            p_00 = p->vObj2Var;
            iVar6 = pAVar5->Id;
            Vec_IntFillExtra(p_00,iVar6 + 1,Fill);
            if (((long)iVar6 < 0) || (p_00->nSize <= iVar6)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar1 = p_00->pArray[iVar6];
            if ((ulong)uVar1 != 0) {
              if (((int)uVar1 < 0) || (p->pSat->size <= (int)uVar1)) {
                __assert_fail("v >= 0 && v < s->size",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                              ,0xd0,"int sat_solver_var_value(sat_solver *, int)");
              }
              if (p->pSat->model[uVar1] == 1) {
                iVar6 = p->pAig->nTruePis * iVar3 + p_01->nRegs + (int)lVar7;
                (&p_01[1].iPo)[iVar6 >> 5] = (&p_01[1].iPo)[iVar6 >> 5] | 1 << ((byte)iVar6 & 0x1f);
              }
            }
          }
          lVar7 = lVar7 + 1;
          pAVar4 = p->pAig;
        } while (lVar7 < pAVar4->nTruePis);
      }
      bVar2 = iVar3 < p->iFrameFail;
      iVar3 = iVar3 + 1;
    } while (bVar2);
  }
  iVar3 = Saig_ManVerifyCex(p->pAig,p_01);
  if (iVar3 == 0) {
    puts("Saig_BmcGenerateCounterExample(): Counter-example is invalid.");
    Abc_CexFree(p_01);
    p_01 = (Abc_Cex_t *)0x0;
  }
  return p_01;
}

Assistant:

Abc_Cex_t * Saig_BmcGenerateCounterExample( Saig_Bmc_t * p )
{
    Abc_Cex_t * pCex;
    Aig_Obj_t * pObj, * pObjFrm;
    int i, f, iVarNum;
    // start the counter-example
    pCex = Abc_CexAlloc( Aig_ManRegNum(p->pAig), Saig_ManPiNum(p->pAig), p->iFrameFail+1 );
    pCex->iFrame = p->iFrameFail;
    pCex->iPo    = p->iOutputFail;
    // copy the bit data
    for ( f = 0; f <= p->iFrameFail; f++ )
    {
        Saig_ManForEachPi( p->pAig, pObj, i )
        {
            pObjFrm = Saig_BmcObjFrame( p, pObj, f );
            if ( pObjFrm == NULL )
                continue;
            iVarNum = Saig_BmcSatNum( p, pObjFrm );
            if ( iVarNum == 0 )
                continue;
            if ( sat_solver_var_value( p->pSat, iVarNum ) )
                Abc_InfoSetBit( pCex->pData, pCex->nRegs + Saig_ManPiNum(p->pAig) * f + i );
        }
    }
    // verify the counter example
    if ( !Saig_ManVerifyCex( p->pAig, pCex ) )
    {
        printf( "Saig_BmcGenerateCounterExample(): Counter-example is invalid.\n" );
        Abc_CexFree( pCex );
        pCex = NULL;
    }
    return pCex;
}